

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_main.cpp
# Opt level: O0

int DoomSpecificInfo(char *buffer,char *end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int local_2c;
  uint local_28;
  int p;
  int i;
  int size;
  char *arg;
  char *end_local;
  char *buffer_local;
  
  iVar1 = ((int)end - (int)buffer) + -2;
  pcVar4 = GetVersionString();
  pcVar5 = GetGitHash();
  iVar2 = snprintf(buffer,(long)iVar1,"ZDoom version %s (%s)\n",pcVar4,pcVar5);
  iVar3 = snprintf(buffer + iVar2,(long)(iVar1 - iVar2),"Compiler version: %s\n",
                   "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                  );
  iVar3 = iVar3 + iVar2;
  local_2c = snprintf(buffer + iVar3,(long)(iVar1 - iVar3),"\nCommand line:");
  local_2c = local_2c + iVar3;
  for (local_28 = 0; iVar2 = DArgs::NumArgs(Args), (int)local_28 < iVar2; local_28 = local_28 + 1) {
    pcVar4 = DArgs::GetArg(Args,local_28);
    iVar2 = snprintf(buffer + local_2c,(long)(iVar1 - local_2c)," %s",pcVar4);
    local_2c = iVar2 + local_2c;
  }
  iVar2 = snprintf(buffer + local_2c,(long)(iVar1 - local_2c),"\n");
  local_2c = iVar2 + local_2c;
  local_28 = 0;
  while (pcVar4 = FWadCollection::GetWadName(&Wads,local_28), pcVar4 != (char *)0x0) {
    iVar2 = snprintf(buffer + local_2c,(long)(iVar1 - local_2c),"\nWad %d: %s",(ulong)local_28,
                     pcVar4);
    local_2c = iVar2 + local_2c;
    local_28 = local_28 + 1;
  }
  if ((gamestate == GS_LEVEL) || (gamestate == GS_TITLELEVEL)) {
    pcVar4 = FString::GetChars(&level.MapName);
    iVar2 = snprintf(buffer + local_2c,(long)(iVar1 - local_2c),"\n\nCurrent map: %s",pcVar4);
    iVar2 = iVar2 + local_2c;
    if ((viewactive & 1U) == 0) {
      local_2c = snprintf(buffer + iVar2,(long)(iVar1 - iVar2),"\n\nView not active.");
      local_2c = local_2c + iVar2;
    }
    else {
      iVar3 = snprintf(buffer + iVar2,(long)(iVar1 - iVar2),"\n\nviewx = %f",ViewPos.X);
      iVar3 = iVar3 + iVar2;
      iVar2 = snprintf(buffer + iVar3,(long)(iVar1 - iVar3),"\nviewy = %f",ViewPos.Y);
      iVar2 = iVar2 + iVar3;
      iVar3 = snprintf(buffer + iVar2,(long)(iVar1 - iVar2),"\nviewz = %f",ViewPos.Z);
      iVar3 = iVar3 + iVar2;
      local_2c = snprintf(buffer + iVar3,(long)(iVar1 - iVar3),"\nviewangle = %f",ViewAngle.Degrees)
      ;
      local_2c = local_2c + iVar3;
    }
  }
  else {
    iVar1 = snprintf(buffer + local_2c,(long)(iVar1 - local_2c),"\n\nNot in a level.");
    local_2c = iVar1 + local_2c;
  }
  buffer[local_2c] = '\n';
  buffer[local_2c + 1] = '\0';
  return local_2c + 2;
}

Assistant:

static int DoomSpecificInfo (char *buffer, char *end)
{
	const char *arg;
	int size = end-buffer-2;
	int i, p;

	p = 0;
	p += snprintf (buffer+p, size-p, GAMENAME" version %s (%s)\n", GetVersionString(), GetGitHash());
#ifdef __VERSION__
	p += snprintf (buffer+p, size-p, "Compiler version: %s\n", __VERSION__);
#endif
	p += snprintf (buffer+p, size-p, "\nCommand line:");
	for (i = 0; i < Args->NumArgs(); ++i)
	{
		p += snprintf (buffer+p, size-p, " %s", Args->GetArg(i));
	}
	p += snprintf (buffer+p, size-p, "\n");
	
	for (i = 0; (arg = Wads.GetWadName (i)) != NULL; ++i)
	{
		p += snprintf (buffer+p, size-p, "\nWad %d: %s", i, arg);
	}

	if (gamestate != GS_LEVEL && gamestate != GS_TITLELEVEL)
	{
		p += snprintf (buffer+p, size-p, "\n\nNot in a level.");
	}
	else
	{
		p += snprintf (buffer+p, size-p, "\n\nCurrent map: %s", level.MapName.GetChars());

		if (!viewactive)
		{
			p += snprintf (buffer+p, size-p, "\n\nView not active.");
		}
		else
		{
			p += snprintf (buffer+p, size-p, "\n\nviewx = %f", ViewPos.X);
			p += snprintf (buffer+p, size-p, "\nviewy = %f", ViewPos.Y);
			p += snprintf (buffer+p, size-p, "\nviewz = %f", ViewPos.Z);
			p += snprintf (buffer+p, size-p, "\nviewangle = %f", ViewAngle.Degrees);
		}
	}
	buffer[p++] = '\n';
	buffer[p++] = '\0';

	return p;
}